

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cached-powers.cc
# Opt level: O0

void FIX::double_conversion::PowersOfTenCache::GetCachedPowerForDecimalExponent
               (int requested_exponent,DiyFp *power,int *found_exponent)

{
  DiyFp local_48;
  uint64_t local_38;
  CachedPower cached_power;
  int index;
  int *found_exponent_local;
  DiyFp *power_local;
  int requested_exponent_local;
  
  if (requested_exponent < -0x15c) {
    __assert_fail("kMinDecimalExponent <= requested_exponent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/cached-powers.cc"
                  ,0xa5,
                  "static void FIX::double_conversion::PowersOfTenCache::GetCachedPowerForDecimalExponent(int, DiyFp *, int *)"
                 );
  }
  if (0x15b < requested_exponent) {
    __assert_fail("requested_exponent < kMaxDecimalExponent + kDecimalExponentDistance",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/cached-powers.cc"
                  ,0xa6,
                  "static void FIX::double_conversion::PowersOfTenCache::GetCachedPowerForDecimalExponent(int, DiyFp *, int *)"
                 );
  }
  cached_power._12_4_ = (requested_exponent + 0x15c) / 8;
  local_38 = *(uint64_t *)(kCachedPowers + (long)(int)cached_power._12_4_ * 0x10);
  cached_power.significand =
       *(uint64_t *)(kCachedPowers + (long)(int)cached_power._12_4_ * 0x10 + 8);
  DiyFp::DiyFp(&local_48,local_38,(int)(short)cached_power.significand);
  power->f_ = local_48.f_;
  power->e_ = local_48.e_;
  *found_exponent = (int)cached_power.significand._2_2_;
  if (requested_exponent < *found_exponent) {
    __assert_fail("*found_exponent <= requested_exponent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/cached-powers.cc"
                  ,0xac,
                  "static void FIX::double_conversion::PowersOfTenCache::GetCachedPowerForDecimalExponent(int, DiyFp *, int *)"
                 );
  }
  if (requested_exponent < *found_exponent + 8) {
    return;
  }
  __assert_fail("requested_exponent < *found_exponent + kDecimalExponentDistance",
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/cached-powers.cc"
                ,0xad,
                "static void FIX::double_conversion::PowersOfTenCache::GetCachedPowerForDecimalExponent(int, DiyFp *, int *)"
               );
}

Assistant:

void PowersOfTenCache::GetCachedPowerForDecimalExponent(int requested_exponent,
                                                        DiyFp* power,
                                                        int* found_exponent) {
  ASSERT(kMinDecimalExponent <= requested_exponent);
  ASSERT(requested_exponent < kMaxDecimalExponent + kDecimalExponentDistance);
  int index =
      (requested_exponent + kCachedPowersOffset) / kDecimalExponentDistance;
  CachedPower cached_power = kCachedPowers[index];
  *power = DiyFp(cached_power.significand, cached_power.binary_exponent);
  *found_exponent = cached_power.decimal_exponent;
  ASSERT(*found_exponent <= requested_exponent);
  ASSERT(requested_exponent < *found_exponent + kDecimalExponentDistance);
}